

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFanout.c
# Opt level: O0

void Ivy_ObjAddFanout(Ivy_Man_t *p,Ivy_Obj_t *pFanin,Ivy_Obj_t *pFanout)

{
  Ivy_Obj_t *pIVar1;
  Ivy_Obj_t **ppIVar2;
  Ivy_Obj_t *pFanout_local;
  Ivy_Obj_t *pFanin_local;
  Ivy_Man_t *p_local;
  
  if (p->fFanout != 0) {
    if (pFanin->pFanout != (Ivy_Obj_t *)0x0) {
      pIVar1 = pFanin->pFanout;
      ppIVar2 = Ivy_ObjNextFanoutPlace(pFanin,pFanout);
      *ppIVar2 = pIVar1;
      ppIVar2 = Ivy_ObjPrevFanoutPlace(pFanin,pFanin->pFanout);
      *ppIVar2 = pFanout;
    }
    pFanin->pFanout = pFanout;
    return;
  }
  __assert_fail("p->fFanout",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/ivy/ivyFanout.c"
                ,0xb9,"void Ivy_ObjAddFanout(Ivy_Man_t *, Ivy_Obj_t *, Ivy_Obj_t *)");
}

Assistant:

void Ivy_ObjAddFanout( Ivy_Man_t * p, Ivy_Obj_t * pFanin, Ivy_Obj_t * pFanout )
{
    assert( p->fFanout );
    if ( pFanin->pFanout )
    {
        *Ivy_ObjNextFanoutPlace(pFanin, pFanout) = pFanin->pFanout;
        *Ivy_ObjPrevFanoutPlace(pFanin, pFanin->pFanout) = pFanout;
    }
    pFanin->pFanout = pFanout;
}